

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_tcd_v2_t * tcd_create_v2(opj_bool p_is_decoder)

{
  opj_tcd_image_v2_t *poVar1;
  int in_EDI;
  opj_tcd_v2_t *l_tcd;
  opj_tcd_v2_t *local_8;
  
  local_8 = (opj_tcd_v2_t *)malloc(0x40);
  if (local_8 == (opj_tcd_v2_t *)0x0) {
    local_8 = (opj_tcd_v2_t *)0x0;
  }
  else {
    memset(local_8,0,0x40);
    local_8->field_0x3c = local_8->field_0x3c & 0xfe | in_EDI != 0;
    poVar1 = (opj_tcd_image_v2_t *)malloc(8);
    local_8->tcd_image = poVar1;
    if (local_8->tcd_image == (opj_tcd_image_v2_t *)0x0) {
      free(local_8);
      local_8 = (opj_tcd_v2_t *)0x0;
    }
    else {
      memset(local_8->tcd_image,0,8);
    }
  }
  return local_8;
}

Assistant:

opj_tcd_v2_t* tcd_create_v2(opj_bool p_is_decoder)
{
	opj_tcd_v2_t *l_tcd = 00;

	/* create the tcd structure */
	l_tcd = (opj_tcd_v2_t*)	opj_malloc(sizeof(opj_tcd_v2_t));
	if (!l_tcd) {
		return 00;
	}
	memset(l_tcd,0,sizeof(opj_tcd_v2_t));

	l_tcd->m_is_decoder = p_is_decoder ? 1 : 0;

	l_tcd->tcd_image = (opj_tcd_image_v2_t*)opj_malloc(sizeof(opj_tcd_image_v2_t));
	if (!l_tcd->tcd_image) {
		opj_free(l_tcd);
		return 00;
	}
	memset(l_tcd->tcd_image,0,sizeof(opj_tcd_image_v2_t));

	return l_tcd;
}